

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_session_init.c
# Opt level: O0

int webSocket_buildRespondShakeKey(uchar *acceptKey,uint acceptKeyLen,uchar *respondKey)

{
  int iVar1;
  int iVar2;
  char *source;
  char *__s;
  size_t sVar3;
  uchar *bindata;
  undefined1 local_78 [4];
  uint GUIDLEN;
  char GUID [37];
  int local_44;
  int n;
  int i;
  char *sha1Data;
  char *sha1DataTemp;
  char *clientKey;
  uchar *respondKey_local;
  uint acceptKeyLen_local;
  uchar *acceptKey_local;
  
  memcpy(local_78,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11",0x25);
  if (acceptKey == (uchar *)0x0) {
    acceptKey_local._4_4_ = 0;
  }
  else {
    source = (char *)calloc(1,(ulong)(acceptKeyLen + 0x2f));
    memset(source,0,(ulong)(acceptKeyLen + 0x2f));
    memcpy(source,acceptKey,(ulong)acceptKeyLen);
    memcpy(source + acceptKeyLen,local_78,0x25);
    source[acceptKeyLen + 0x25] = '\0';
    __s = sha1_hash(source);
    sVar3 = strlen(__s);
    iVar1 = (int)sVar3;
    bindata = (uchar *)calloc(1,(long)(iVar1 / 2 + 1));
    memset(bindata,0,(long)(iVar1 / 2 + 1));
    for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 2) {
      iVar2 = htoi(__s,local_44,2);
      bindata[local_44 / 2] = (uchar)iVar2;
    }
    acceptKey_local._4_4_ = base64_encode(bindata,(char *)respondKey,iVar1 / 2);
    free(__s);
    free(bindata);
    free(source);
  }
  return acceptKey_local._4_4_;
}

Assistant:

int webSocket_buildRespondShakeKey(unsigned char *acceptKey, unsigned int acceptKeyLen, unsigned char *respondKey) {
    char *clientKey;
    char *sha1DataTemp;
    char *sha1Data;
    int i, n;
    const char GUID[] = "258EAFA5-E914-47DA-95CA-C5AB0DC85B11";
    unsigned int GUIDLEN;

    if(acceptKey == NULL)
        return 0;
    GUIDLEN = sizeof(GUID);
    clientKey = (char *)calloc(1, sizeof(char)*(acceptKeyLen + GUIDLEN + 10));
    memset(clientKey, 0, (acceptKeyLen + GUIDLEN + 10));
    //
    memcpy(clientKey, acceptKey, acceptKeyLen);
    memcpy(&clientKey[acceptKeyLen], GUID, GUIDLEN);
    clientKey[acceptKeyLen + GUIDLEN] = '\0';
    //
    sha1DataTemp = sha1_hash(clientKey);
    n = strlen(sha1DataTemp);
    sha1Data = (char *)calloc(1, n / 2 + 1);
    memset(sha1Data, 0, n / 2 + 1);
    //
    for(i = 0; i < n; i += 2)
        sha1Data[ i / 2 ] = htoi(sha1DataTemp, i, 2);
    n = base64_encode((const unsigned char *)sha1Data, (char *)respondKey, (n / 2));
    //
    free(sha1DataTemp);
    free(sha1Data);
    free(clientKey);
    return n;
}